

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_data.cpp
# Opt level: O0

int32_t __thiscall
cornelich::vanilla_data::find_next_data_file_number
          (vanilla_data *this,int32_t cycle,int32_t thread_id)

{
  type_conflict tVar1;
  bool bVar2;
  int iVar3;
  string *s;
  cycle_formatter *cycle_00;
  streamer *psVar4;
  reference this_00;
  string_type *psVar5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end_00;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_318;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_310;
  int local_304;
  undefined1 local_300 [4];
  int32_t index;
  string local_2e0 [8];
  string_type name;
  directory_entry *entry;
  directory_iterator __end1;
  directory_iterator __begin1;
  directory_iterator local_2a0;
  iterator_range<boost::filesystem::directory_iterator> local_298;
  iterator_range<boost::filesystem::directory_iterator> *local_288;
  iterator_range<boost::filesystem::directory_iterator> *__range1;
  streamer local_278;
  undefined1 local_f0 [8];
  string data_prefix;
  directory_iterator local_d0;
  directory_iterator end;
  directory_iterator begin;
  error_code err;
  undefined1 local_a0 [64];
  path local_60;
  undefined1 local_40 [8];
  path path;
  int32_t local_18;
  int32_t last_number;
  int32_t thread_id_local;
  int32_t cycle_local;
  vanilla_data *this_local;
  
  path._28_4_ = 0xffffffff;
  local_18 = thread_id;
  last_number = cycle;
  _thread_id_local = this;
  s = vanilla_chronicle_settings::path_abi_cxx11_(this->m_settings);
  boost::filesystem::path::path(&local_60,s);
  cycle_00 = vanilla_chronicle_settings::cycle_format(this->m_settings);
  cycle_formatter::date_from_cycle_abi_cxx11_((cycle_formatter *)local_a0,(int64_t)cycle_00);
  boost::filesystem::path::path((path *)(local_a0 + 0x20),(string_type *)local_a0);
  boost::filesystem::operator/((path *)local_40,&local_60,(path *)(local_a0 + 0x20));
  boost::filesystem::path::~path((path *)(local_a0 + 0x20));
  std::__cxx11::string::~string((string *)local_a0);
  boost::filesystem::path::~path(&local_60);
  boost::system::error_code::error_code((error_code *)&begin);
  boost::filesystem::directory_iterator::directory_iterator
            (&end,(path *)local_40,(error_code *)&begin);
  boost::filesystem::directory_iterator::directory_iterator(&local_d0);
  util::streamer::streamer(&local_278);
  psVar4 = util::streamer::operator<<
                     (&local_278,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      DATA_FILE_NAME_PREFIX_abi_cxx11_);
  psVar4 = util::streamer::operator<<(psVar4,&local_18);
  __range1._7_1_ = 0x2d;
  util::streamer::operator<<(psVar4,(char *)((long)&__range1 + 7));
  util::streamer::str_abi_cxx11_((streamer *)local_f0);
  util::streamer::~streamer(&local_278);
  boost::filesystem::directory_iterator::directory_iterator(&local_2a0,&end);
  boost::filesystem::directory_iterator::directory_iterator(&__begin1,&local_d0);
  boost::make_iterator_range<boost::filesystem::directory_iterator>
            ((boost *)&local_298,&local_2a0,&__begin1);
  boost::filesystem::directory_iterator::~directory_iterator(&__begin1);
  boost::filesystem::directory_iterator::~directory_iterator(&local_2a0);
  local_288 = &local_298;
  boost::iterator_range_detail::
  iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
  ::begin((iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
           *)&__end1);
  boost::iterator_range_detail::
  iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
  ::end((iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
         *)&entry);
  while (tVar1 = boost::iterators::operator!=
                           ((iterator_facade<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                             *)&__end1,
                            (iterator_facade<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                             *)&entry), tVar1) {
    this_00 = boost::iterators::detail::
              iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
              ::operator*((iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                           *)&__end1);
    boost::filesystem::directory_entry::path(this_00);
    boost::filesystem::path::filename();
    psVar5 = boost::filesystem::path::native_abi_cxx11_((path *)local_300);
    std::__cxx11::string::string(local_2e0,(string *)psVar5);
    boost::filesystem::path::~path((path *)local_300);
    bVar2 = boost::algorithm::starts_with<std::__cxx11::string,std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0
                      );
    if (bVar2) {
      local_304 = -1;
      local_318._M_current = (char *)std::__cxx11::string::begin();
      iVar3 = std::__cxx11::string::size();
      local_310 = __gnu_cxx::
                  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator+(&local_318,(long)iVar3);
      end_00._M_current = (char *)std::__cxx11::string::end();
      util::parse_number<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                (local_310,end_00,&local_304);
      if ((int)path._28_4_ < local_304) {
        path._28_4_ = local_304;
      }
    }
    std::__cxx11::string::~string(local_2e0);
    boost::iterators::detail::
    iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
    ::operator++((iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                  *)&__end1);
  }
  boost::filesystem::directory_iterator::~directory_iterator((directory_iterator *)&entry);
  boost::filesystem::directory_iterator::~directory_iterator(&__end1);
  boost::iterator_range<boost::filesystem::directory_iterator>::~iterator_range(&local_298);
  iVar3 = path._28_4_ + 1;
  std::__cxx11::string::~string((string *)local_f0);
  boost::filesystem::directory_iterator::~directory_iterator(&local_d0);
  boost::filesystem::directory_iterator::~directory_iterator(&end);
  boost::filesystem::path::~path((path *)local_40);
  return iVar3;
}

Assistant:

std::int32_t vanilla_data::find_next_data_file_number(std::int32_t cycle, std::int32_t thread_id) const
{
    std::int32_t last_number = -1;
    const auto path = fs::path(m_settings.path()) / m_settings.cycle_format().date_from_cycle(cycle);

    boost::system::error_code err;
    fs::directory_iterator begin(path, err);
    fs::directory_iterator end;

    const auto data_prefix = (util::streamer() << DATA_FILE_NAME_PREFIX << thread_id << '-').str();

    for(const auto & entry : boost::make_iterator_range(begin, end))
    {
        auto name = entry.path().filename().native();
        if(boost::algorithm::starts_with(name, data_prefix))
        {
            std::int32_t index = -1;
            util::parse_number(name.begin() + (std::int32_t)data_prefix.size(), name.end(), index);
            if(last_number < index)
                last_number = index;
        }
    }
    // Move to the next data file
    return last_number + 1;

}